

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

bool __thiscall soul::RenderingVenue::Pimpl::createSession(Pimpl *this,SessionReadyCallback *cb)

{
  anon_class_40_2_28a14680 local_60;
  TaskFunction local_38;
  SessionReadyCallback *local_18;
  SessionReadyCallback *cb_local;
  Pimpl *this_local;
  
  local_60.this = this;
  local_18 = cb;
  cb_local = (SessionReadyCallback *)this;
  std::
  function<void_(std::unique_ptr<soul::Venue::Session,_std::default_delete<soul::Venue::Session>_>)>
  ::function(&local_60.callback,cb);
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::createSession(std::function<void(std::unique_ptr<soul::Venue::Session,std::default_delete<soul::Venue::Session>>)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)&local_38,&local_60);
  TaskThread::Queue::addTask(&this->createSessionQueue,&local_38);
  std::function<void_(std::atomic<int>_&)>::~function(&local_38);
  createSession(std::function<void(std::unique_ptr<soul::Venue::Session,std::default_delete<soul::Venue::Session>>)>)
  ::{lambda(std::atomic<int>&)#1}::~atomic((_lambda_std__atomic<int>___1_ *)&local_60);
  return true;
}

Assistant:

bool createSession (SessionReadyCallback cb)
    {
        createSessionQueue.addTask ([this, callback = std::move (cb)] (TaskThread::ShouldStopFlag&)
        {
            callback (std::make_unique<Pimpl::SessionImpl> (*this, performerFactory->createPerformer()));
        });

        return true;
    }